

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.h
# Opt level: O0

bool __thiscall
siamese::GrowingAlignedDataBuffer::GrowZeroPadded
          (GrowingAlignedDataBuffer *this,Allocator *allocator,uint bytes)

{
  uint8_t *puVar1;
  uint in_EDX;
  long *in_RDI;
  uint8_t *unaff_retaddr;
  undefined4 in_stack_00000008;
  Realloc in_stack_fffffffffffffff8;
  uint in_stack_fffffffffffffffc;
  
  if ((*in_RDI == 0) || (*(uint *)(in_RDI + 1) < in_EDX)) {
    puVar1 = pktalloc::Allocator::Reallocate
                       ((Allocator *)CONCAT44(bytes,in_stack_00000008),unaff_retaddr,
                        in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    *in_RDI = (long)puVar1;
    if (*in_RDI == 0) {
      *(undefined4 *)(in_RDI + 1) = 0;
      return false;
    }
    memset((void *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1)),0,(ulong)(in_EDX - (int)in_RDI[1]));
    *(uint *)(in_RDI + 1) = in_EDX;
  }
  return true;
}

Assistant:

bool GrowZeroPadded(pktalloc::Allocator* allocator, unsigned bytes)
    {
        SIAMESE_DEBUG_ASSERT(allocator && bytes > 0);
        if (!Data || bytes > Bytes)
        {
            Data = allocator->Reallocate(Data, bytes, pktalloc::Realloc::CopyExisting);
            if (!Data)
            {
                Bytes = 0;
                return false;
            }

            memset(Data + Bytes, 0, bytes - Bytes);
            Bytes = bytes;
        }
        return true;
    }